

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  StringArg ip;
  InetAddress udpLisetenAddr;
  sz_pid_t v;
  uint uVar2;
  int iVar3;
  int kcpMode;
  LogStream *this;
  char **ppcVar4;
  int iVar5;
  int *in_FS_OFFSET;
  SourceFile file;
  undefined1 local_1990 [8];
  KcpTcpEventLoop loop;
  EchoServer server;
  InetAddress tcpListenAddr;
  string local_78;
  undefined1 auStack_58 [8];
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> udpListenAddr;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "kcp_echo_server.cpp";
    sznet::Logger::Logger((Logger *)local_1990,file,0x7f);
    if (6 < (uint)(((int)&loop + 0xfa8) - (int)loop.m_random._M_x[0x19d])) {
      *(undefined2 *)(loop.m_random._M_x[0x19d] + 4) = 0x203d;
      *(undefined4 *)loop.m_random._M_x[0x19d] = 0x20646970;
      loop.m_random._M_x[0x19d] = loop.m_random._M_x[0x19d] + 6;
    }
    v = sznet::sz_getpid();
    this = sznet::LogStream::operator<<((LogStream *)&loop,v);
    ppcVar4 = &(this->m_buffer).m_cur;
    pcVar1 = (this->m_buffer).m_cur;
    if (8 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,", tid = ",8);
      *ppcVar4 = *ppcVar4 + 8;
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    if (*in_FS_OFFSET == 0) {
      sznet::CurrentThread::cacheTid();
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    sznet::LogStream::operator<<(this,*in_FS_OFFSET);
    sznet::Logger::~Logger((Logger *)local_1990);
  }
  if (argc < 6) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n"
           ,*argv);
  }
  else {
    ip.m_str = argv[1];
    uVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    numThreads = 2;
    if (iVar3 != 0) {
      numThreads = iVar3;
    }
    iVar3 = atoi(argv[4]);
    kcpMode = atoi(argv[5]);
    iVar5 = 0;
    sznet::net::InetAddress::InetAddress((InetAddress *)&server.m_kcpMode,ip,(uint16_t)uVar2,false);
    auStack_58 = (undefined1  [8])0x0;
    udpListenAddr.
    super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    udpListenAddr.
    super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < numThreads) {
      do {
        local_1990._0_4_ = (uVar2 & 0xffff) + 1 + iVar5;
        std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
        emplace_back<int>((vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
                           *)auStack_58,(int *)local_1990);
        iVar5 = iVar5 + 1;
      } while (iVar5 < numThreads);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"base","");
    udpLisetenAddr.field_0._8_4_ = tcpListenAddr.field_0._0_4_;
    udpLisetenAddr.field_0._0_8_ = stack0xffffffffffffff4c;
    udpLisetenAddr.field_0._12_4_ = tcpListenAddr.field_0.m_addr6.sin6_flowinfo;
    udpLisetenAddr.field_0._16_4_ = tcpListenAddr.field_0._8_4_;
    udpLisetenAddr.field_0._20_8_ = tcpListenAddr.field_0._12_8_;
    sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
              ((KcpTcpEventLoop *)local_1990,udpLisetenAddr,&local_78,0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    g_pMainLoopsRun = (EventLoop *)local_1990;
    EchoServer::EchoServer
              ((EchoServer *)&loop.m_kcpMode,(KcpTcpEventLoop *)local_1990,
               (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
               auStack_58,(InetAddress *)&server.m_kcpMode,iVar3,kcpMode);
    EchoServer::start((EchoServer *)&loop.m_kcpMode);
    sznet::net::EventLoop::loop((EventLoop *)local_1990);
    if (server.m_codec.m_messageCallback.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)server.m_codec.m_messageCallback.super__Function_base._M_functor._8_8_)
                (&server.m_startTime,&server.m_startTime,3);
    }
    sznet::net::KcpWithTcpServer::~KcpWithTcpServer((KcpWithTcpServer *)&loop.m_kcpMode);
    sznet::net::KcpTcpEventLoop::~KcpTcpEventLoop((KcpTcpEventLoop *)local_1990);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 5)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort = static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);
    int kcpMode = atoi(argv[5]);
    
    InetAddress tcpListenAddr(szSvrip, sSvrPort);
    std::vector<InetAddress> udpListenAddr;
    for (int i = 1; i <= numThreads; ++i)
    {
        udpListenAddr.emplace_back(sSvrPort + i);
    }

    KcpTcpEventLoop loop(tcpListenAddr, "base", 0);
    g_pMainLoopsRun = &loop;
    EchoServer server(&loop, udpListenAddr, tcpListenAddr, mode, kcpMode);

    server.start();

    loop.loop();

    return 0;
}